

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

void Eigen::internal::
     generic_product_impl<chrono::ChMatrixSPMV,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::SparseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,ChMatrixSPMV *lhs,
               Matrix<double,__1,_1,_0,__1,_1> *rhs,Scalar *alpha)

{
  ulong uVar1;
  double *pdVar2;
  ChSystemDescriptor *pCVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [64];
  ChMatrixSPMV lhs_;
  DenseStorage<double,__1,__1,_1,_0> local_28;
  
  if ((*alpha == 1.0) && (!NAN(*alpha))) {
    pCVar3 = lhs->m_sysd;
    DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_28,(DenseStorage<double,__1,__1,_1,_0> *)&lhs->m_vect);
    (*pCVar3->_vptr_ChSystemDescriptor[0x17])(pCVar3,&local_28,rhs);
    uVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (uVar1 != local_28.m_rows) {
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar4 = uVar1 + 7;
    if (-1 < (long)uVar1) {
      uVar4 = uVar1;
    }
    uVar4 = uVar4 & 0xfffffffffffffff8;
    if (7 < (long)uVar1) {
      lVar5 = 0;
      do {
        auVar6 = vaddpd_avx512f(*(undefined1 (*) [64])(local_28.m_data + lVar5),
                                *(undefined1 (*) [64])(pdVar2 + lVar5));
        *(undefined1 (*) [64])(pdVar2 + lVar5) = auVar6;
        lVar5 = lVar5 + 8;
      } while (lVar5 < (long)uVar4);
    }
    if ((long)uVar4 < (long)uVar1) {
      do {
        pdVar2[uVar4] = local_28.m_data[uVar4] + pdVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    else if (local_28.m_data == (double *)0x0) {
      return;
    }
    free((void *)local_28.m_data[-1]);
    return;
  }
  __assert_fail("alpha == Scalar(1) && \"scaling is not implemented\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChIterativeSolverLS.cpp"
                ,0x95,
                "static void Eigen::internal::generic_product_impl<chrono::ChMatrixSPMV, Eigen::Matrix<double, -1, 1>, Eigen::SparseShape, Eigen::DenseShape, 7>::scaleAndAddTo(Dest &, const chrono::ChMatrixSPMV &, const Rhs &, const Scalar &) [Lhs = chrono::ChMatrixSPMV, Rhs = Eigen::Matrix<double, -1, 1>, LhsShape = Eigen::SparseShape, RhsShape = Eigen::DenseShape, ProductType = 7, Dest = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const chrono::ChMatrixSPMV& lhs, const Rhs& rhs, const Scalar& alpha) {
        assert(alpha == Scalar(1) && "scaling is not implemented");
        EIGEN_ONLY_USED_FOR_DEBUG(alpha);

        // Hack to allow calling ChSystemDescriptor::SystemProduct
        auto lhs_ = const_cast<chrono::ChMatrixSPMV&>(lhs);

        lhs_.sysd()->SystemProduct(lhs_.vect(), rhs);
        dst += lhs_.vect();
    }